

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture3D_GL.cpp
# Opt level: O0

void __thiscall
Diligent::Texture3D_GL::CopyTexSubimage
          (Texture3D_GL *this,GLContextState *GLState,CopyTexSubimageAttribs *Attribs)

{
  GLint GVar1;
  GLint GVar2;
  GLint GVar3;
  GLint GVar4;
  Uint32 UVar5;
  Uint32 UVar6;
  PFNGLCOPYTEXSUBIMAGE3DPROC p_Var7;
  GLenum GVar8;
  Uint32 UVar9;
  Uint32 UVar10;
  GLTextureObj *TexObj;
  Char *Message;
  undefined1 local_50 [8];
  string msg;
  GLenum err;
  CopyTexSubimageAttribs *Attribs_local;
  GLContextState *GLState_local;
  Texture3D_GL *this_local;
  
  GVar8 = TextureBaseGL::GetBindTarget(&this->super_TextureBaseGL);
  TexObj = TextureBaseGL::GetGLHandle(&this->super_TextureBaseGL);
  GLContextState::BindTexture(GLState,-1,GVar8,TexObj);
  p_Var7 = __glewCopyTexSubImage3D;
  GVar8 = TextureBaseGL::GetBindTarget(&this->super_TextureBaseGL);
  GVar1 = Attribs->DstMip;
  GVar2 = Attribs->DstX;
  GVar3 = Attribs->DstY;
  GVar4 = Attribs->DstZ;
  UVar5 = Attribs->SrcBox->MinX;
  UVar6 = Attribs->SrcBox->MinY;
  UVar9 = Box::Width(Attribs->SrcBox);
  UVar10 = Box::Height(Attribs->SrcBox);
  (*p_Var7)(GVar8,GVar1,GVar2,GVar3,GVar4,UVar5,UVar6,UVar9,UVar10);
  msg.field_2._12_4_ = glGetError();
  if (msg.field_2._12_4_ != 0) {
    LogError<false,char[43],char[17],unsigned_int>
              (false,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture3D_GL.cpp"
               ,0xfd,(char (*) [43])"Failed to copy subimage data to texture 3D",
               (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)local_50,(char (*) [6])0x4585f6);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture3D_GL.cpp"
               ,0xfd);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void Texture3D_GL::CopyTexSubimage(GLContextState& GLState, const CopyTexSubimageAttribs& Attribs)
{
    GLState.BindTexture(-1, GetBindTarget(), GetGLHandle());

    glCopyTexSubImage3D(GetBindTarget(),
                        Attribs.DstMip,
                        Attribs.DstX,
                        Attribs.DstY,
                        Attribs.DstZ,
                        Attribs.SrcBox.MinX,
                        Attribs.SrcBox.MinY,
                        Attribs.SrcBox.Width(),
                        Attribs.SrcBox.Height());
    DEV_CHECK_GL_ERROR("Failed to copy subimage data to texture 3D");
}